

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

int run_test_fs_event_watch_file(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_loop_t *loop;
  int iVar2;
  int extraout_EDX;
  char *__s1;
  long *path;
  uv_fs_event_t *puVar3;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_218 [32];
  uv_fs_t uStack_1f8;
  uv_loop_t *puStack_38;
  long local_20;
  
  loop = uv_default_loop();
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file1");
  create_file("watch_dir/file2");
  iVar1 = uv_fs_event_init(loop,&fs_event);
  local_20 = (long)iVar1;
  if (local_20 == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file2",0);
    local_20 = (long)iVar1;
    if (local_20 != 0) goto LAB_00184634;
    iVar1 = uv_timer_init(loop,&timer);
    local_20 = (long)iVar1;
    if (local_20 != 0) goto LAB_00184641;
    iVar1 = uv_timer_start(&timer,timer_cb_file,100,100);
    local_20 = (long)iVar1;
    if (local_20 != 0) goto LAB_0018464e;
    uv_run(loop,UV_RUN_DEFAULT);
    local_20 = 1;
    if (fs_event_cb_called != 1) goto LAB_0018465b;
    local_20 = 2;
    if (timer_cb_called != 2) goto LAB_00184668;
    local_20 = 2;
    if (close_cb_called != 2) goto LAB_00184675;
    remove("watch_dir/file2");
    remove("watch_dir/file1");
    remove("watch_dir/");
    uv_walk(loop,close_walk_cb,(void *)0x0);
    uv_run(loop,UV_RUN_DEFAULT);
    local_20 = 0;
    iVar1 = uv_loop_close(loop);
    if (local_20 == iVar1) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_event_watch_file_cold_1();
LAB_00184634:
    run_test_fs_event_watch_file_cold_2();
LAB_00184641:
    run_test_fs_event_watch_file_cold_3();
LAB_0018464e:
    run_test_fs_event_watch_file_cold_4();
LAB_0018465b:
    run_test_fs_event_watch_file_cold_5();
LAB_00184668:
    run_test_fs_event_watch_file_cold_6();
LAB_00184675:
    run_test_fs_event_watch_file_cold_7();
  }
  path = &local_20;
  run_test_fs_event_watch_file_cold_8();
  iVar2 = 0x41;
  auStack_218._0_8_ = (void *)0x1846b5;
  puStack_38 = loop;
  iVar1 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)(auStack_218 + 0x20),(char *)path,0x41,0x180,
                     (uv_fs_cb)0x0);
  auStack_218._24_8_ = SEXT48(iVar1);
  auStack_218._16_8_ = 0;
  if ((uv_close_cb)auStack_218._24_8_ == (uv_close_cb)0x0) {
    auStack_218._0_8_ = (void *)0x1846e1;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_218 + 0x20));
    iVar2 = 0;
    auStack_218._0_8_ = (void *)0x1846ef;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)(auStack_218 + 0x20),
                        (uv_os_fd_t)uStack_1f8.result,(uv_fs_cb)0x0);
    auStack_218._24_8_ = SEXT48(iVar1);
    auStack_218._16_8_ = 0;
    if ((uv_close_cb)auStack_218._24_8_ == (uv_close_cb)0x0) {
      auStack_218._0_8_ = (void *)0x184715;
      uv_fs_req_cleanup((uv_fs_t *)(auStack_218 + 0x20));
      return extraout_EAX;
    }
  }
  else {
    auStack_218._0_8_ = (void *)0x18472e;
    create_file_cold_1();
  }
  puVar3 = (uv_fs_event_t *)(auStack_218 + 0x18);
  __s1 = auStack_218 + 0x10;
  auStack_218._0_8_ = fs_event_cb_file;
  create_file_cold_2();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar3 == &fs_event) {
    auStack_218._0_8_ = SEXT48(iVar2);
    if ((code *)auStack_218._0_8_ != (code *)0x0) goto LAB_0018480b;
    auStack_218._0_8_ = SEXT48(extraout_EDX);
    if ((code *)auStack_218._0_8_ != (code *)0x2) goto LAB_0018481a;
    iVar1 = strcmp(__s1,"file2");
    auStack_218._0_8_ = SEXT48(iVar1);
    if ((code *)auStack_218._0_8_ == (code *)0x0) {
      iVar1 = uv_fs_event_stop(&fs_event);
      auStack_218._0_8_ = SEXT48(iVar1);
      if ((code *)auStack_218._0_8_ == (code *)0x0) {
        uv_close((uv_handle_t *)&fs_event,close_cb);
        return extraout_EAX_00;
      }
      goto LAB_00184838;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_0018480b:
    fs_event_cb_file_cold_2();
LAB_0018481a:
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_00184838:
  handle = (uv_handle_t *)auStack_218;
  fs_event_cb_file_cold_5();
  if (timer_cb_called != 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file2");
    uv_close(handle,close_cb);
    return extraout_EAX_01;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file1");
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(fs_event_watch_file) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif

  uv_loop_t* loop = uv_default_loop();
  int r;

  /* Setup */
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file1");
  create_file("watch_dir/file2");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event, fs_event_cb_file, "watch_dir/file2", 0);
  ASSERT_OK(r);
  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);
  r = uv_timer_start(&timer, timer_cb_file, 100, 100);
  ASSERT_OK(r);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(1, fs_event_cb_called);
  ASSERT_EQ(2, timer_cb_called);
  ASSERT_EQ(2, close_cb_called);

  /* Cleanup */
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}